

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeywordExtractor.hpp
# Opt level: O3

void __thiscall
cppjieba::KeywordExtractor::LoadStopWordDict(KeywordExtractor *this,string *filePath)

{
  char cVar1;
  ostream *poVar2;
  istream *piVar3;
  __hashtable *__h;
  string line;
  ifstream ifs;
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_3c0;
  Logger local_3b8;
  long local_238 [65];
  
  std::ifstream::ifstream((istream *)local_238,(filePath->_M_dataplus)._M_p,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    limonp::Logger::Logger
              (&local_3b8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/KeywordExtractor.hpp"
               ,0x7e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_3b8,"exp: [ifs.is_open()",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3b8,"] false. ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3b8,"open ",5);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_3b8,(filePath->_M_dataplus)._M_p,
                        filePath->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," failed",7);
    limonp::Logger::~Logger(&local_3b8);
  }
  local_3b8._8_8_ = 0;
  local_3b8._16_1_ = 0;
  local_3b8._0_8_ = (void *)((long)&local_3b8 + 0x10U);
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_3b8,cVar1);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    local_3c0 = (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 *)&this->stopWords_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&this->stopWords_,(string *)&local_3b8,&local_3c0);
  }
  if ((this->stopWords_)._M_h._M_element_count != 0) {
    if ((void *)local_3b8._0_8_ != (void *)((long)&local_3b8 + 0x10U)) {
      operator_delete((void *)local_3b8._0_8_);
    }
    std::ifstream::~ifstream(local_238);
    return;
  }
  __assert_fail("stopWords_.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/KeywordExtractor.hpp"
                ,0x83,"void cppjieba::KeywordExtractor::LoadStopWordDict(const string &)");
}

Assistant:

void LoadStopWordDict(const string& filePath) {
    ifstream ifs(filePath.c_str());
    XCHECK(ifs.is_open()) << "open " << filePath << " failed";
    string line ;
    while (getline(ifs, line)) {
      stopWords_.insert(line);
    }
    assert(stopWords_.size());
  }